

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O0

PackageSymbol *
slang::ast::PackageSymbol::fromSyntax
          (Scope *scope,ModuleDeclarationSyntax *syntax,NetType *defaultNetType,
          optional<slang::TimeScale> directiveTimeScale)

{
  MemberSyntax *this;
  PackageSymbol *pPVar1;
  optional<slang::ast::VariableLifetime> args;
  bool bVar2;
  bool hasPrecision;
  int iVar3;
  ModuleHeaderSyntax *pMVar4;
  iterator ppMVar5;
  TimeScale *pTVar6;
  TimeUnitsDeclarationSyntax *syntax_00;
  PackageExportDeclarationSyntax *pPVar7;
  undefined4 extraout_var;
  Info *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *src;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  iterator iVar8;
  Token token;
  span<const_slang::syntax::PackageImportItemSyntax_*,_18446744073709551615UL> local_178;
  span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL> local_168;
  PackageImportItemSyntax *local_158;
  PackageImportItemSyntax *item;
  iterator __end5;
  iterator __begin5;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *__range5;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> exportDecls;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  bool first;
  VariableLifetime local_70;
  VariableLifetime local_6c;
  SourceLocation local_68;
  string_view local_60;
  PackageSymbol *local_50;
  PackageSymbol *result;
  Info *local_40;
  _Optional_payload_base<slang::ast::VariableLifetime> local_38;
  optional<slang::ast::VariableLifetime> lifetime;
  Compilation *comp;
  NetType *defaultNetType_local;
  ModuleDeclarationSyntax *syntax_local;
  Scope *scope_local;
  optional<slang::TimeScale> directiveTimeScale_local;
  
  lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::VariableLifetime> =
       (_Optional_base<slang::ast::VariableLifetime,_true,_true>)Scope::getCompilation(scope);
  pMVar4 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->(&syntax->header);
  result = *(PackageSymbol **)&pMVar4->lifetime;
  local_40 = (pMVar4->lifetime).info;
  token.info = extraout_RDX;
  token._0_8_ = local_40;
  local_38 = (_Optional_payload_base<slang::ast::VariableLifetime>)
             SemanticFacts::getVariableLifetime((SemanticFacts *)result,token);
  args = lifetime;
  pMVar4 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->(&syntax->header);
  local_60 = parsing::Token::valueText(&pMVar4->name);
  pMVar4 = not_null<slang::syntax::ModuleHeaderSyntax_*>::operator->(&syntax->header);
  local_68 = parsing::Token::location(&pMVar4->name);
  local_70 = Static;
  local_6c = std::optional<slang::ast::VariableLifetime>::value_or<slang::ast::VariableLifetime>
                       ((optional<slang::ast::VariableLifetime> *)&local_38,&local_70);
  local_50 = BumpAllocator::
             emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                       ((BumpAllocator *)
                        args.super__Optional_base<slang::ast::VariableLifetime,_true,_true>.
                        _M_payload.super__Optional_payload_base<slang::ast::VariableLifetime>,
                        (Compilation *)
                        args.super__Optional_base<slang::ast::VariableLifetime,_true,_true>.
                        _M_payload.super__Optional_payload_base<slang::ast::VariableLifetime>,
                        &local_60,&local_68,defaultNetType,&local_6c);
  Symbol::setSyntax(&local_50->super_Symbol,(SyntaxNode *)syntax);
  pPVar1 = local_50;
  syntax_01 = slang::syntax::SyntaxList::operator_cast_to_span
                        ((SyntaxList *)&(syntax->super_MemberSyntax).attributes);
  Symbol::setAttributes(&pPVar1->super_Symbol,scope,syntax_01);
  unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._23_1_ = 1;
  std::optional<slang::SourceRange>::optional
            ((optional<slang::SourceRange> *)
             &precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
              super__Optional_payload_base<slang::SourceRange>._M_engaged);
  std::optional<slang::SourceRange>::optional
            ((optional<slang::SourceRange> *)(exportDecls.stackBase + 0x18));
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL>::SmallVector
            ((SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> *)&__range2);
  __end2 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                     (&(syntax->members).
                       super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  ppMVar5 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                      (&(syntax->members).
                        super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
  src = extraout_RDX_00;
  for (; __end2 != ppMVar5; __end2 = __end2 + 1) {
    this = *__end2;
    if ((this->super_SyntaxNode).kind == TimeUnitsDeclaration) {
      pTVar6 = &local_50->timeScale;
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::TimeUnitsDeclarationSyntax>
                            (&this->super_SyntaxNode);
      SemanticFacts::populateTimeScale
                (pTVar6,scope,syntax_00,
                 (optional<slang::SourceRange> *)
                 &precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::SourceRange>._M_engaged,
                 (optional<slang::SourceRange> *)(exportDecls.stackBase + 0x18),
                 (bool)unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                       super__Optional_payload_base<slang::SourceRange>._23_1_);
      src = extraout_RDX_01;
    }
    else {
      unitsRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._23_1_ = 0;
      if ((this->super_SyntaxNode).kind == PackageExportAllDeclaration) {
        local_50->hasExportAll = true;
      }
      else if ((this->super_SyntaxNode).kind == PackageExportDeclaration) {
        pPVar7 = slang::syntax::SyntaxNode::as<slang::syntax::PackageExportDeclarationSyntax>
                           (&this->super_SyntaxNode);
        iVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::begin
                          (&pPVar7->items);
        __end5.index = (size_t)iVar8.list;
        iVar8 = slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::end
                          (&pPVar7->items);
        while( true ) {
          __end5.list = (ParentList *)iVar8.index;
          item = (PackageImportItemSyntax *)iVar8.list;
          bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PackageImportItemSyntax_*,_unsigned_long,_slang::syntax::PackageImportItemSyntax_**,_slang::syntax::PackageImportItemSyntax_*&>
                  ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PackageImportItemSyntax_*,_unsigned_long,_slang::syntax::PackageImportItemSyntax_**,_slang::syntax::PackageImportItemSyntax_*&>
                                *)&__end5.index,
                               (iterator_base<slang::syntax::PackageImportItemSyntax_*> *)&item);
          if (!bVar2) break;
          local_158 = slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::
                      iterator_base<slang::syntax::PackageImportItemSyntax_*>::operator*
                                ((iterator_base<slang::syntax::PackageImportItemSyntax_*> *)
                                 &__end5.index);
          SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::push_back
                    ((SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)&__range2,
                     &local_158);
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PackageImportItemSyntax_*,_unsigned_long,_slang::syntax::PackageImportItemSyntax_**,_slang::syntax::PackageImportItemSyntax_*&>
          ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::iterator_base<slang::syntax::PackageImportItemSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::PackageImportItemSyntax_*,_unsigned_long,_slang::syntax::PackageImportItemSyntax_**,_slang::syntax::PackageImportItemSyntax_*&>
                        *)&__end5.index);
          iVar8.index = (size_t)__end5.list;
          iVar8.list = (ParentList *)item;
        }
      }
      Scope::addMembers(&local_50->super_Scope,&this->super_SyntaxNode);
      src = extraout_RDX_02;
    }
  }
  iVar3 = SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::copy
                    ((SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)&__range2,
                     (EVP_PKEY_CTX *)
                     lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>.
                     _M_payload.super__Optional_payload_base<slang::ast::VariableLifetime>,src);
  local_178.data_ = (pointer)CONCAT44(extraout_var,iVar3);
  nonstd::span_lite::
  span<const_slang::syntax::PackageImportItemSyntax_*const,_18446744073709551615UL>::
  span<const_slang::syntax::PackageImportItemSyntax_*,_18446744073709551615UL,_0>
            (&local_168,&local_178);
  (local_50->exportDecls).data_ = local_168.data_;
  (local_50->exportDecls).size_ = local_168.size_;
  pTVar6 = &local_50->timeScale;
  bVar2 = std::optional<slang::SourceRange>::has_value
                    ((optional<slang::SourceRange> *)
                     &precisionRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload
                      .super__Optional_payload_base<slang::SourceRange>._M_engaged);
  hasPrecision = std::optional<slang::SourceRange>::has_value
                           ((optional<slang::SourceRange> *)(exportDecls.stackBase + 0x18));
  SemanticFacts::populateTimeScale(pTVar6,scope,directiveTimeScale,bVar2,hasPrecision);
  pPVar1 = local_50;
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> *)&__range2);
  return pPVar1;
}

Assistant:

PackageSymbol& PackageSymbol::fromSyntax(const Scope& scope, const ModuleDeclarationSyntax& syntax,
                                         const NetType& defaultNetType,
                                         std::optional<TimeScale> directiveTimeScale) {
    auto& comp = scope.getCompilation();
    auto lifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime);
    auto result = comp.emplace<PackageSymbol>(comp, syntax.header->name.valueText(),
                                              syntax.header->name.location(), defaultNetType,
                                              lifetime.value_or(VariableLifetime::Static));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;
    SmallVector<const PackageImportItemSyntax*> exportDecls;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            SemanticFacts::populateTimeScale(result->timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;

        if (member->kind == SyntaxKind::PackageExportAllDeclaration) {
            result->hasExportAll = true;
        }
        else if (member->kind == SyntaxKind::PackageExportDeclaration) {
            for (auto item : member->as<PackageExportDeclarationSyntax>().items)
                exportDecls.push_back(item);
        }

        result->addMembers(*member);
    }

    result->exportDecls = exportDecls.copy(comp);

    SemanticFacts::populateTimeScale(result->timeScale, scope, directiveTimeScale,
                                     unitsRange.has_value(), precisionRange.has_value());
    return *result;
}